

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinput.c
# Opt level: O3

xcb_generic_iterator_t
xcb_input_device_state_data_resolution_resolution_min_end
          (xcb_input_device_state_t *R,xcb_input_device_state_data_t *S)

{
  xcb_generic_iterator_t xVar1;
  
  xVar1.data = (S->resolution).resolution_min + (S->resolution).num_valuators;
  xVar1._8_8_ = (ulong)(uint)((int)xVar1.data - (int)S) << 0x20;
  return xVar1;
}

Assistant:

xcb_generic_iterator_t
xcb_input_device_state_data_resolution_resolution_min_end (const xcb_input_device_state_t *R,
                                                           const xcb_input_device_state_data_t *S)
{
    xcb_generic_iterator_t i;
    i.data = S->resolution.resolution_min + S->resolution.num_valuators;
    i.rem = 0;
    i.index = (char *) i.data - (char *) S;
    return i;
}